

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mau.cpp
# Opt level: O0

MauResult mau_proxy_create(MauProxyConfig *config,MauChannelConfig *channel,char *hostname,
                          uint16_t port,MauProxy *proxyOut)

{
  bool bVar1;
  ProxySession *pPVar2;
  MauProxyConfig *in_RDI;
  undefined8 *in_R8;
  MauResult result;
  ProxySession *session;
  MauChannelConfig *in_stack_00000418;
  MauProxyConfig *in_stack_00000420;
  uint16_t in_stack_0000042e;
  char *in_stack_00000430;
  ProxySession *in_stack_00000438;
  MauChannelConfig *in_stack_ffffffffffffff88;
  ProxySession *local_60;
  ProxySession *in_stack_ffffffffffffffb0;
  MauResult local_34;
  ProxySession *local_30;
  
  IncrementLoggerRefs();
  local_30 = (ProxySession *)0x0;
  if ((in_RDI == (MauProxyConfig *)0x0) || (in_R8 == (undefined8 *)0x0)) {
    local_34 = Mau_InvalidInput;
  }
  else if (in_RDI->Version == 3) {
    bVar1 = ValidateMauProxyConfig(in_RDI);
    if (bVar1) {
      bVar1 = ValidateMauChannelConfig(in_stack_ffffffffffffff88);
      if (bVar1) {
        pPVar2 = (ProxySession *)operator_new(0x5d0,(nothrow_t *)&std::nothrow);
        local_60 = (ProxySession *)0x0;
        if (pPVar2 != (ProxySession *)0x0) {
          mau::ProxySession::ProxySession(in_stack_ffffffffffffffb0);
          local_60 = pPVar2;
        }
        local_30 = local_60;
        if (local_60 == (ProxySession *)0x0) {
          local_34 = Mau_OOM;
        }
        else {
          local_34 = mau::ProxySession::Initialize
                               (in_stack_00000438,in_stack_00000430,in_stack_0000042e,
                                in_stack_00000420,in_stack_00000418);
          if (local_34 != Mau_Success) {
            if (local_60 != (ProxySession *)0x0) {
              mau::ProxySession::~ProxySession(local_60);
              operator_delete(local_60);
            }
            local_30 = (ProxySession *)0x0;
          }
        }
      }
      else {
        local_34 = Mau_InvalidInput;
      }
    }
    else {
      local_34 = Mau_InvalidInput;
    }
  }
  else {
    local_34 = Mau_InvalidInput;
  }
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = local_30;
  }
  if (local_30 == (ProxySession *)0x0) {
    DecrementLoggerRefs();
  }
  return local_34;
}

Assistant:

MAU_EXPORT MauResult mau_proxy_create(
    const MauProxyConfig*    config, ///< [in] Configuration for the socket
    const MauChannelConfig* channel, ///< [in] Channel configuration
    const char*            hostname, ///< [in] Hostname of the server
    uint16_t                   port, ///< [in] UDP Port for the server
    MauProxy*              proxyOut  ///< [out] Created socket, or 0 on failure
)
{
    IncrementLoggerRefs();

    ProxySession* session = nullptr;
    MauResult result = Mau_Error;

    if (!config || !proxyOut)
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    if (config->Version != MAU_VERSION)
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    if (!ValidateMauProxyConfig(*config))
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    if (!ValidateMauChannelConfig(*channel))
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    session = new (std::nothrow) ProxySession;
    if (!session)
    {
        MAU_DEBUG_BREAK(); // Out of memory
        result = Mau_OOM;
        goto OnError;
    }

    result = session->Initialize(hostname, port, *config, *channel);
    if (MAU_FAILED(result))
    {
        delete session;
        session = nullptr;
        goto OnError;
    }

OnError:
    if (proxyOut)
        *proxyOut = reinterpret_cast<MauProxy>(session);

    if (!session)
        DecrementLoggerRefs();

    return result;
}